

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  int itemsize;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong extraout_RDX;
  ulong uVar14;
  uchar *puVar15;
  uchar *extraout_RDX_00;
  uint uVar16;
  uchar **ppuVar17;
  uint uVar18;
  byte *data_00;
  long lVar19;
  bool bVar20;
  uchar **ppuStack_200b8;
  uchar **hash_table [16384];
  uchar *local_68;
  uchar *local_40;
  uint local_38;
  uint local_34;
  
  local_40 = (uchar *)0x0;
  uVar8 = 5;
  if (5 < quality) {
    uVar8 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_40,1,(int)out_len);
  iVar7 = *(int *)(local_40 + -4);
  *(int *)(local_40 + -4) = iVar7 + 1;
  local_40[iVar7] = 'x';
  iVar6 = *(int *)(local_40 + -4);
  iVar7 = iVar6 + 1;
  if (*(int *)(local_40 + -8) <= iVar7) {
    stbiw__sbgrowf(&local_40,1,itemsize);
    iVar6 = *(int *)(local_40 + -4);
    iVar7 = iVar6 + 1;
  }
  *(int *)(local_40 + -4) = iVar7;
  local_40[iVar6] = '^';
  local_38 = 1;
  local_34 = local_38;
  puVar9 = stbiw__zlib_flushf(local_40,&local_38,(int *)&local_34);
  local_38 = local_38 | 1 << ((byte)local_34 & 0x1f);
  local_34 = local_34 + 2;
  puVar9 = stbiw__zlib_flushf(puVar9,&local_38,(int *)&local_34);
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    hash_table[lVar10 + -1] = (uchar **)0x0;
  }
  iVar7 = (int)uVar8;
  local_40 = puVar9;
  for (uVar16 = 0; (int)uVar16 < data_len + -3; uVar16 = uVar18 + uVar16) {
    data_00 = data + (int)uVar16;
    uVar2 = stbiw__zhash(data_00);
    ppuVar17 = hash_table[(ulong)(uVar2 & 0x3fff) - 1];
    if (ppuVar17 == (uchar **)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = (long)*(int *)((long)ppuVar17 + -4);
    }
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    uVar18 = 3;
    local_68 = (uchar *)0x0;
    uVar14 = extraout_RDX;
    for (lVar19 = 0; iVar6 = (int)uVar14, lVar10 != lVar19; lVar19 = lVar19 + 1) {
      puVar15 = ppuVar17[lVar19];
      if ((long)(int)(uVar16 - 0x8000) < (long)puVar15 - (long)data) {
        uVar3 = stbiw__zlib_countm(puVar15,data_00,data_len - uVar16);
        uVar5 = uVar18;
        if ((int)uVar18 < (int)uVar3) {
          uVar5 = uVar3;
        }
        uVar14 = (ulong)uVar5;
        bVar20 = (int)uVar18 <= (int)uVar3;
        uVar18 = uVar5;
        if (bVar20) {
          local_68 = puVar15;
        }
      }
    }
    if (ppuVar17 == (uchar **)0x0) {
LAB_00107740:
      stbiw__sbgrowf(hash_table + ((ulong)(uVar2 & 0x3fff) - 1),8,iVar6);
      ppuVar17 = hash_table[(ulong)(uVar2 & 0x3fff) - 1];
      iVar4 = *(int *)((long)ppuVar17 + -4);
      iVar13 = iVar4 + 1;
    }
    else {
      iVar4 = *(int *)((long)ppuVar17 + -4);
      if (*(int *)((long)ppuVar17 + -4) == iVar7 * 2) {
        memmove(ppuVar17,ppuVar17 + uVar8,uVar8 * 8);
        *(int *)((long)ppuVar17 + -4) = iVar7;
        iVar4 = iVar7;
        iVar6 = extraout_EDX;
      }
      iVar13 = iVar4 + 1;
      if (*(int *)(ppuVar17 + -1) <= iVar13) goto LAB_00107740;
    }
    *(int *)((long)ppuVar17 + -4) = iVar13;
    ppuVar17[iVar4] = data_00;
    if (local_68 == (uchar *)0x0) {
LAB_001077f2:
      uVar18 = local_34;
      uVar2 = local_38;
      bVar1 = *data_00;
      bVar12 = (byte)local_34;
      if (bVar1 < 0x90) {
        iVar6 = stbiw__zlib_bitrev(bVar1 + 0x30,8);
        local_38 = iVar6 << (bVar12 & 0x1f);
        local_34 = uVar18 + 8;
      }
      else {
        iVar6 = stbiw__zlib_bitrev(bVar1 | 0x100,9);
        local_38 = iVar6 << (bVar12 & 0x1f);
        local_34 = uVar18 + 9;
      }
      local_38 = uVar2 | local_38;
      uVar18 = 1;
LAB_001079a6:
      puVar9 = stbiw__zlib_flushf(puVar9,&local_38,(int *)&local_34);
    }
    else {
      uVar2 = stbiw__zhash(data_00 + 1);
      ppuVar17 = hash_table[(ulong)(uVar2 & 0x3fff) - 1];
      if (ppuVar17 == (uchar **)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(uint *)((long)ppuVar17 + -4);
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
        if (((long)(int)(uVar16 - 0x7fff) < (long)ppuVar17[uVar14] - (long)data) &&
           (uVar5 = stbiw__zlib_countm(ppuVar17[uVar14],data_00 + 1,~uVar16 + data_len),
           (int)uVar18 < (int)uVar5)) goto LAB_001077f2;
      }
      local_68._0_4_ = (int)data_00 - (int)local_68;
      if ((0x7fff < (int)local_68) || (0x102 < (int)uVar18)) {
        __assert_fail("d <= 32767 && best <= 258",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                      ,0x20f,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)");
      }
      uVar14 = 0;
      do {
        uVar11 = uVar14;
        uVar14 = uVar11 + 1;
      } while ((int)(uint)stbi_zlib_compress::lengthc[uVar11 + 1] <= (int)uVar18);
      iVar6 = (int)(uVar11 + 1);
      if (uVar11 < 0x17) {
        iVar6 = stbiw__zlib_bitrev(iVar6,7);
        local_38 = local_38 | iVar6 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 7;
      }
      else {
        iVar6 = stbiw__zlib_bitrev(iVar6 + 0xa8,8);
        local_38 = local_38 | iVar6 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 8;
      }
      puVar9 = stbiw__zlib_flushf(puVar9,&local_38,(int *)&local_34);
      uVar11 = uVar11 & 0xffffffff;
      if (0xffffffffffffffeb < uVar11 - 0x1c) {
        local_38 = local_38 |
                   uVar18 - stbi_zlib_compress::lengthc[uVar11] << ((byte)local_34 & 0x1f);
        local_34 = ""[uVar11] + local_34;
        puVar9 = stbiw__zlib_flushf(puVar9,&local_38,(int *)&local_34);
      }
      uVar14 = 0xffffffffffffffff;
      do {
        lVar10 = uVar14 + 2;
        uVar14 = uVar14 + 1;
      } while ((int)(uint)stbi_zlib_compress::distc[lVar10] <= (int)local_68);
      iVar6 = stbiw__zlib_bitrev((int)uVar14,5);
      local_38 = local_38 | iVar6 << ((byte)local_34 & 0x1f);
      local_34 = local_34 + 5;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_38,(int *)&local_34);
      if (3 < uVar14) {
        local_38 = local_38 |
                   (int)local_68 - (uint)stbi_zlib_compress::distc[uVar14 & 0xffffffff] <<
                   ((byte)local_34 & 0x1f);
        local_34 = ""[uVar14 & 0xffffffff] + local_34;
        goto LAB_001079a6;
      }
    }
  }
  local_40 = puVar9;
  for (lVar10 = (long)(int)uVar16; uVar2 = local_34, uVar16 = local_38, lVar10 < data_len;
      lVar10 = lVar10 + 1) {
    bVar1 = data[lVar10];
    if (bVar1 < 0x90) {
      uVar18 = bVar1 + 0x30;
      iVar7 = 8;
    }
    else {
      uVar18 = bVar1 | 0x100;
      iVar7 = 9;
    }
    iVar6 = stbiw__zlib_bitrev(uVar18,iVar7);
    local_38 = uVar16 | iVar6 << ((byte)uVar2 & 0x1f);
    local_34 = iVar7 + uVar2;
    puVar9 = stbiw__zlib_flushf(puVar9,&local_38,(int *)&local_34);
  }
  local_40 = puVar9;
  iVar7 = stbiw__zlib_bitrev(0,7);
  local_38 = local_38 | iVar7 << ((byte)local_34 & 0x1f);
  uVar16 = local_34 + 7;
  do {
    local_34 = uVar16;
    puVar9 = stbiw__zlib_flushf(puVar9,&local_38,(int *)&local_34);
    uVar16 = local_34 + 1;
  } while (local_34 != 0);
  local_40 = puVar9;
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    if (hash_table[lVar10 + -1] != (uchar **)0x0) {
      free(hash_table[lVar10 + -1] + -1);
    }
  }
  puVar15 = (uchar *)((long)data_len % 0x15b0 & 0xffffffff);
  uVar8 = (long)data_len % 0x15b0 & 0xffffffff;
  uVar18 = 0;
  uVar16 = 1;
  for (uVar2 = 0; (int)uVar2 < data_len; uVar2 = uVar2 + iVar7) {
    iVar7 = (int)uVar8;
    uVar5 = uVar2;
    while( true ) {
      bVar20 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar20) break;
      uVar16 = uVar16 + data[uVar5];
      uVar18 = uVar18 + uVar16;
      uVar5 = uVar5 + 1;
    }
    uVar16 = uVar16 % 0xfff1;
    puVar15 = (uchar *)((ulong)uVar18 % 0xfff1);
    uVar8 = 0x15b0;
    uVar18 = (uint)puVar15;
  }
  if (puVar9 != (uchar *)0x0) {
    iVar6 = *(int *)(puVar9 + -4);
    iVar7 = iVar6 + 1;
    puVar15 = puVar9;
    if (iVar7 < *(int *)(puVar9 + -8)) goto LAB_00107b2f;
  }
  stbiw__sbgrowf(&local_40,1,(int)puVar15);
  iVar6 = *(int *)(local_40 + -4);
  iVar7 = iVar6 + 1;
  puVar9 = local_40;
LAB_00107b2f:
  *(int *)(puVar9 + -4) = iVar7;
  puVar9[iVar6] = (uchar)(uVar18 >> 8);
  if (*(int *)(puVar9 + -8) <= *(int *)(puVar9 + -4) + 1) {
    stbiw__sbgrowf(&local_40,1,(int)puVar9);
    puVar9 = extraout_RDX_00;
  }
  iVar4 = (int)puVar9;
  iVar7 = *(int *)(local_40 + -4);
  *(int *)(local_40 + -4) = iVar7 + 1;
  local_40[iVar7] = (uchar)uVar18;
  iVar6 = *(int *)(local_40 + -4);
  iVar7 = iVar6 + 1;
  if (*(int *)(local_40 + -8) <= iVar7) {
    stbiw__sbgrowf(&local_40,1,iVar4);
    iVar6 = *(int *)(local_40 + -4);
    iVar7 = iVar6 + 1;
    iVar4 = extraout_EDX_00;
  }
  *(int *)(local_40 + -4) = iVar7;
  local_40[iVar6] = (uchar)(uVar16 >> 8);
  iVar6 = *(int *)(local_40 + -4);
  iVar7 = iVar6 + 1;
  if (*(int *)(local_40 + -8) <= iVar7) {
    stbiw__sbgrowf(&local_40,1,iVar4);
    iVar6 = *(int *)(local_40 + -4);
    iVar7 = iVar6 + 1;
  }
  *(int *)(local_40 + -4) = iVar7;
  local_40[iVar6] = (uchar)uVar16;
  iVar7 = *(int *)(local_40 + -4);
  *out_len = iVar7;
  puVar9 = (uchar *)memmove(local_40 + -8,local_40,(long)iVar7);
  return puVar9;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int i=0, s1=1, s2=0, blocklen = data_len % 5552;
      int j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}